

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_util.cpp
# Opt level: O0

NodeContext * EnsureAnyNodeContext(any *context)

{
  long lVar1;
  NodeContext *pNVar2;
  undefined8 uVar3;
  string *in_RDI;
  long in_FS_OFFSET;
  NodeContext *node_context;
  any *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pNVar2 = util::AnyPtr<node::NodeContext>(in_stack_ffffffffffffff98);
  if (pNVar2 == (NodeContext *)0x0) {
    uVar3 = __cxa_allocate_exception(0x58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               in_stack_ffffffffffffffd0,(allocator<char> *)in_RDI);
    JSONRPCError(in_stack_ffffffffffffffdc,in_RDI);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(uVar3,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pNVar2;
  }
  __stack_chk_fail();
}

Assistant:

NodeContext& EnsureAnyNodeContext(const std::any& context)
{
    auto node_context = util::AnyPtr<NodeContext>(context);
    if (!node_context) {
        throw JSONRPCError(RPC_INTERNAL_ERROR, "Node context not found");
    }
    return *node_context;
}